

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::Clipper::Clipper(Clipper *this,int initOptions)

{
  int initOptions_local;
  Clipper *this_local;
  
  ClipperBase::ClipperBase((ClipperBase *)&this->field_0x88);
  this->_vptr_Clipper = (_func_int **)&PTR_ExecuteInternal_0077bae0;
  *(undefined ***)&this->field_0x88 = &PTR__Clipper_0077bb28;
  std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::vector(&this->m_Joins);
  std::vector<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>::vector(&this->m_GhostJoins);
  std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::vector
            (&this->m_IntersectList);
  std::__cxx11::list<long_long,_std::allocator<long_long>_>::list(&this->m_Maxima);
  this->m_ExecuteLocked = false;
  (this->_vptr_Clipper[-3] + 8)
  [(long)&(this->m_GhostJoins).
          super__Vector_base<ClipperLib::Join_*,_std::allocator<ClipperLib::Join_*>_>] = (code)0x0;
  this->m_ReverseOutput = (initOptions & 1U) != 0;
  this->m_StrictSimple = (initOptions & 2U) != 0;
  (this->_vptr_Clipper[-3] + 0x10)
  [(long)&(this->m_IntersectList).
          super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
  ] = (_func_int)((initOptions & 4U) != 0);
  (this->_vptr_Clipper[-3] + 0x11)
  [(long)&(this->m_IntersectList).
          super__Vector_base<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>
  ] = (code)0x0;
  return;
}

Assistant:

Clipper::Clipper(int initOptions) : ClipperBase() //constructor
{
  m_ExecuteLocked = false;
  m_UseFullRange = false;
  m_ReverseOutput = ((initOptions & ioReverseSolution) != 0);
  m_StrictSimple = ((initOptions & ioStrictlySimple) != 0);
  m_PreserveCollinear = ((initOptions & ioPreserveCollinear) != 0);
  m_HasOpenPaths = false;
#ifdef use_xyz  
  m_ZFill = 0;
#endif
}